

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.hpp
# Opt level: O0

string * __thiscall History::get_last_cmd(History *this,string *sess_id,string *pwd)

{
  bool bVar1;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  sockaddr *in_RDX;
  long in_RSI;
  string *in_RDI;
  Query query;
  string *cmd;
  allocator *paVar2;
  Query *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  Database *in_stack_ffffffffffffff88;
  Query *in_stack_ffffffffffffff90;
  allocator local_52;
  undefined1 local_51;
  Query local_50;
  sockaddr *local_20;
  sockaddr *local_18;
  
  local_20 = (sockaddr *)CONCAT44(in_register_0000000c,in_ECX);
  local_18 = in_RDX;
  sqlite::Query::Query
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_51 = 0;
  paVar2 = &local_52;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",paVar2);
  std::allocator<char>::~allocator((allocator<char> *)&local_52);
  sqlite::Query::bind(&local_50,(int)in_RSI + 0x50,local_18,in_ECX);
  sqlite::Query::bind(&local_50,(int)in_RSI + 0xe0,local_20,in_ECX);
  while (bVar1 = sqlite::Query::exec_step(in_stack_ffffffffffffff90), bVar1) {
    schema::ColumnBase::getPos((ColumnBase *)(in_RSI + 0x120));
    sqlite::Query::get_string_abi_cxx11_(in_stack_ffffffffffffff78,(int)((ulong)paVar2 >> 0x20));
    std::__cxx11::string::operator=(in_RDI,(string *)&stack0xffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  }
  local_51 = 1;
  sqlite::Query::~Query((Query *)0x1bd096);
  return in_RDI;
}

Assistant:

std::string get_last_cmd(const std::string& sess_id, const std::string& pwd) {
    sqlite::Query query(db, lcSch.select);
    std::string cmd = "";

    query.bind(lcSch.sess_id.bName,
               sess_id);  // TODO(dkolmakov): Implement type safe binding
    query.bind(lcSch.pwd.bName, pwd);

    while (query.exec_step()) {
      cmd = query.get_string(lcSch.cmd.getPos());
    }

    return cmd;
  }